

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O1

void random_init(RandomState *rs,double d)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  uVar1 = 0x11090601;
  lVar2 = 0;
  do {
    dVar4 = (double)(ulong)(uint)(1 << (sbyte)uVar1);
    uVar1 = uVar1 >> 8;
    d = d * 3.141592653589793 + 2.718281828459045;
    if ((ulong)dVar4 <= (ulong)d) {
      dVar4 = 0.0;
    }
    rs->gen[lVar2] = (long)dVar4 + (long)d;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  rs->valid = 1;
  iVar3 = 10;
  do {
    lj_math_random_step(rs);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

static void random_init(RandomState *rs, double d)
{
  uint32_t r = 0x11090601;  /* 64-k[i] as four 8 bit constants. */
  int i;
  for (i = 0; i < 4; i++) {
    U64double u;
    uint32_t m = 1u << (r&255);
    r >>= 8;
    u.d = d = d * 3.14159265358979323846 + 2.7182818284590452354;
    if (u.u64 < m) u.u64 += m;  /* Ensure k[i] MSB of gen[i] are non-zero. */
    rs->gen[i] = u.u64;
  }
  rs->valid = 1;
  for (i = 0; i < 10; i++)
    lj_math_random_step(rs);
}